

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

void google::protobuf::compiler::php::GenerateEnumFile
               (FileDescriptor *file,EnumDescriptor *en,bool is_descriptor,
               GeneratorContext *generator_context)

{
  EnumValueDescriptor *value;
  long lVar1;
  bool is_descriptor_00;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  undefined8 *puVar4;
  size_type *psVar5;
  int extraout_EDX;
  undefined7 in_register_00000011;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [12];
  Printer printer;
  string fullname;
  string filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  undefined4 local_174;
  Printer local_170;
  ZeroCopyOutputStream *local_d0;
  FileDescriptor *local_c8;
  EnumDescriptor *local_c0;
  string local_b8;
  string local_98;
  GeneratorContext *local_78;
  string local_70;
  string local_50;
  
  local_174 = (undefined4)CONCAT71(in_register_00000011,is_descriptor);
  local_c8 = file;
  GeneratedClassFileName<google::protobuf::EnumDescriptor>(&local_50,en,is_descriptor);
  local_78 = generator_context;
  iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&local_50);
  local_d0 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2);
  io::Printer::Printer(&local_170,local_d0,'^');
  io::Printer::Print<char[9],std::__cxx11::string>
            (&local_170,
             "<?php\n# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# source: ^filename^\n\n"
             ,(char (*) [9])"filename",
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_c8);
  FilenameToClassname(&local_98,&local_50);
  auVar8 = std::__cxx11::string::find_last_of((char *)&local_98,0x39571d,0xffffffffffffffff);
  iVar2 = auVar8._8_4_;
  lVar6 = auVar8._0_8_ << 0x20;
  if (lVar6 != -0x100000000) {
    std::__cxx11::string::substr((ulong)&local_198,(ulong)&local_98);
    io::Printer::Print<char[5],std::__cxx11::string>
              (&local_170,"namespace ^name^;\n\n",(char (*) [5])0x3958cc,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    io::Printer::Print<>(&local_170,"use UnexpectedValueException;\n\n");
    iVar2 = extraout_EDX;
  }
  GenerateEnumDocComment(&local_170,en,iVar2);
  if (lVar6 != -0x100000000) {
    std::__cxx11::string::substr((ulong)&local_198,(ulong)&local_98);
    std::__cxx11::string::operator=((string *)&local_98,(string *)&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
  }
  io::Printer::Print<char[5],std::__cxx11::string>
            (&local_170,"class ^name^\n{\n",(char (*) [5])0x3958cc,&local_98);
  io::Printer::Indent(&local_170);
  io::Printer::Indent(&local_170);
  local_c0 = en;
  if (0 < *(int *)(en + 0x2c)) {
    lVar7 = 0;
    lVar6 = 0;
    do {
      lVar1 = *(long *)(en + 0x30);
      value = (EnumValueDescriptor *)(lVar7 + lVar1);
      GenerateEnumValueDocComment(&local_170,value);
      ConstantNamePrefix(&local_b8,*(string **)value);
      plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_b8,**(ulong **)value);
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      psVar5 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_198.field_2._M_allocated_capacity = *psVar5;
        local_198.field_2._8_8_ = plVar3[3];
      }
      else {
        local_198.field_2._M_allocated_capacity = *psVar5;
        local_198._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_198._M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      IntToString_abi_cxx11_
                (&local_70,(php *)(ulong)*(uint *)(lVar1 + 0x10 + lVar7),
                 (int32)local_198._M_string_length);
      io::Printer::Print<char[5],std::__cxx11::string,char[7],std::__cxx11::string>
                (&local_170,"const ^name^ = ^number^;\n",(char (*) [5])0x3958cc,&local_198,
                 (char (*) [7])0x3b3c9d,&local_70);
      en = local_c0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x28;
    } while (lVar6 < *(int *)(en + 0x2c));
  }
  io::Printer::Print<>(&local_170,"\nprivate static $valueToName = [\n");
  io::Printer::Indent(&local_170);
  io::Printer::Indent(&local_170);
  if (0 < *(int *)(en + 0x2c)) {
    lVar7 = 0;
    lVar6 = 0;
    do {
      lVar1 = *(long *)(en + 0x30);
      ConstantNamePrefix(&local_b8,*(string **)(lVar1 + lVar7));
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_b8,**(ulong **)(lVar1 + lVar7));
      en = local_c0;
      psVar5 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_198.field_2._M_allocated_capacity = *psVar5;
        local_198.field_2._8_8_ = puVar4[3];
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      }
      else {
        local_198.field_2._M_allocated_capacity = *psVar5;
        local_198._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_198._M_string_length = puVar4[1];
      *puVar4 = psVar5;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      io::Printer::Print<char[5],std::__cxx11::string>
                (&local_170,"self::^name^ => \'^name^\',\n",(char (*) [5])0x3958cc,&local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x28;
    } while (lVar6 < *(int *)(en + 0x2c));
  }
  io::Printer::Outdent(&local_170);
  io::Printer::Outdent(&local_170);
  io::Printer::Print<>(&local_170,"];\n");
  io::Printer::Print<>(&local_170,"\npublic static function name($value)\n{\n");
  io::Printer::Indent(&local_170);
  io::Printer::Indent(&local_170);
  io::Printer::Print<>(&local_170,"if (!isset(self::$valueToName[$value])) {\n");
  io::Printer::Indent(&local_170);
  io::Printer::Indent(&local_170);
  io::Printer::Print<>(&local_170,"throw new UnexpectedValueException(sprintf(\n");
  io::Printer::Indent(&local_170);
  io::Printer::Indent(&local_170);
  io::Printer::Indent(&local_170);
  io::Printer::Indent(&local_170);
  io::Printer::Print<>
            (&local_170,"\'Enum %s has no name defined for value %s\', __CLASS__, $value));\n");
  io::Printer::Outdent(&local_170);
  io::Printer::Outdent(&local_170);
  io::Printer::Outdent(&local_170);
  io::Printer::Outdent(&local_170);
  io::Printer::Outdent(&local_170);
  io::Printer::Outdent(&local_170);
  io::Printer::Print<>(&local_170,"}\nreturn self::$valueToName[$value];\n");
  io::Printer::Outdent(&local_170);
  io::Printer::Outdent(&local_170);
  io::Printer::Print<>(&local_170,"}\n\n");
  io::Printer::Print<>(&local_170,"\npublic static function value($name)\n{\n");
  io::Printer::Indent(&local_170);
  io::Printer::Indent(&local_170);
  io::Printer::Print<>
            (&local_170,
             "$const = __CLASS__ . \'::\' . strtoupper($name);\nif (!defined($const)) {\n");
  io::Printer::Indent(&local_170);
  io::Printer::Indent(&local_170);
  io::Printer::Print<>(&local_170,"throw new UnexpectedValueException(sprintf(\n");
  io::Printer::Indent(&local_170);
  io::Printer::Indent(&local_170);
  io::Printer::Indent(&local_170);
  io::Printer::Indent(&local_170);
  io::Printer::Print<>
            (&local_170,"\'Enum %s has no value defined for name %s\', __CLASS__, $name));\n");
  io::Printer::Outdent(&local_170);
  io::Printer::Outdent(&local_170);
  io::Printer::Outdent(&local_170);
  io::Printer::Outdent(&local_170);
  io::Printer::Outdent(&local_170);
  io::Printer::Outdent(&local_170);
  io::Printer::Print<>(&local_170,"}\nreturn constant($const);\n");
  io::Printer::Outdent(&local_170);
  io::Printer::Outdent(&local_170);
  io::Printer::Print<>(&local_170,"}\n");
  io::Printer::Outdent(&local_170);
  io::Printer::Outdent(&local_170);
  io::Printer::Print<>(&local_170,"}\n\n");
  if (*(long *)(en + 0x18) != 0) {
    io::Printer::Print<>
              (&local_170,
               "// Adding a class alias for backwards compatibility with the previous class name.\n"
              );
    is_descriptor_00 = local_174._0_1_;
    LegacyFullClassName<google::protobuf::EnumDescriptor>(&local_198,en,local_174._0_1_);
    io::Printer::Print<char[4],std::__cxx11::string,char[4],std::__cxx11::string>
              (&local_170,"class_alias(^new^::class, \\^old^::class);\n\n",(char (*) [4])"new",
               &local_98,(char (*) [4])"old",&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    LegacyGenerateClassFile<google::protobuf::EnumDescriptor>(local_c8,en,is_descriptor_00,local_78)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  io::Printer::~Printer(&local_170);
  if (local_d0 != (ZeroCopyOutputStream *)0x0) {
    (*local_d0->_vptr_ZeroCopyOutputStream[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void GenerateEnumFile(const FileDescriptor* file, const EnumDescriptor* en,
                      bool is_descriptor, GeneratorContext* generator_context) {
  std::string filename = GeneratedClassFileName(en, is_descriptor);
  std::unique_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '^');

  GenerateHead(file, &printer);

  std::string fullname = FilenameToClassname(filename);
  int lastindex = fullname.find_last_of("\\");

  if (lastindex != string::npos) {
    printer.Print(
        "namespace ^name^;\n\n",
        "name", fullname.substr(0, lastindex));

    // We only need this 'use' statement if the enum has a namespace.
    // Otherwise, we get a warning that the use statement has no effect.
    printer.Print("use UnexpectedValueException;\n\n");
  }

  GenerateEnumDocComment(&printer, en, is_descriptor);

  if (lastindex != string::npos) {
    fullname = fullname.substr(lastindex + 1);
  }

  printer.Print(
      "class ^name^\n"
      "{\n",
      "name", fullname);
  Indent(&printer);

  for (int i = 0; i < en->value_count(); i++) {
    const EnumValueDescriptor* value = en->value(i);
    GenerateEnumValueDocComment(&printer, value);
    printer.Print("const ^name^ = ^number^;\n",
                  "name", ConstantNamePrefix(value->name()) + value->name(),
                  "number", IntToString(value->number()));
  }

  printer.Print("\nprivate static $valueToName = [\n");
  Indent(&printer);
  for (int i = 0; i < en->value_count(); i++) {
    const EnumValueDescriptor* value = en->value(i);
    printer.Print("self::^name^ => '^name^',\n",
                  "name", ConstantNamePrefix(value->name()) + value->name());
  }
  Outdent(&printer);
  printer.Print("];\n");

  printer.Print(
      "\npublic static function name($value)\n"
      "{\n");
  Indent(&printer);
  printer.Print("if (!isset(self::$valueToName[$value])) {\n");
  Indent(&printer);
  printer.Print("throw new UnexpectedValueException(sprintf(\n");
  Indent(&printer);
  Indent(&printer);
  printer.Print("'Enum %s has no name defined for value %s', __CLASS__, $value));\n");
  Outdent(&printer);
  Outdent(&printer);
  Outdent(&printer);
  printer.Print("}\n"
                "return self::$valueToName[$value];\n");
  Outdent(&printer);
  printer.Print("}\n\n");

  printer.Print(
      "\npublic static function value($name)\n"
      "{\n");
  Indent(&printer);
  printer.Print("$const = __CLASS__ . '::' . strtoupper($name);\n"
                "if (!defined($const)) {\n");
  Indent(&printer);
  printer.Print("throw new UnexpectedValueException(sprintf(\n");
  Indent(&printer);
  Indent(&printer);
  printer.Print("'Enum %s has no value defined for name %s', __CLASS__, $name));\n");
  Outdent(&printer);
  Outdent(&printer);
  Outdent(&printer);
  printer.Print("}\n"
                "return constant($const);\n");
  Outdent(&printer);
  printer.Print("}\n");

  Outdent(&printer);
  printer.Print("}\n\n");

  // write legacy file for backwards compatiblity with nested messages and enums
  if (en->containing_type() != NULL) {
    printer.Print(
        "// Adding a class alias for backwards compatibility with the previous class name.\n");
    printer.Print(
        "class_alias(^new^::class, \\^old^::class);\n\n",
        "new", fullname,
        "old", LegacyFullClassName(en, is_descriptor));
    LegacyGenerateClassFile(file, en, is_descriptor, generator_context);
  }
}